

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O3

void __thiscall itis::SplayTree::prettyPrint(SplayTree *this,Node *vertex)

{
  Node *pNVar1;
  Node *pNVar2;
  ostream *this_00;
  Node *pNVar3;
  char *pcVar4;
  
  do {
    pNVar3 = vertex;
    if (pNVar3 == (Node *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"empty tree",10);
      this_00 = (ostream *)&std::cout;
    }
    else {
      pNVar1 = pNVar3->left_child;
      pNVar2 = pNVar3->right_child;
      this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pNVar3->data);
      if (pNVar1 == (Node *)0x0) {
        if (pNVar2 != (Node *)0x0) {
          pcVar4 = ": ";
          goto LAB_001045b4;
        }
        std::__ostream_insert<char,std::char_traits<char>>(this_00,": no children",0xd);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(this_00,": ",2);
        this_00 = (ostream *)std::ostream::operator<<(this_00,pNVar3->left_child->data);
        if (pNVar2 != (Node *)0x0) {
          pcVar4 = ", ";
LAB_001045b4:
          std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar4,2);
          this_00 = (ostream *)std::ostream::operator<<(this_00,pNVar3->right_child->data);
        }
      }
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + (char)this_00);
    std::ostream::put((char)this_00);
    std::ostream::flush();
    vertex = pNVar3->left_child;
    pNVar1 = pNVar3->right_child;
    if (vertex == (Node *)0x0) {
      vertex = pNVar1;
      if (pNVar1 == (Node *)0x0) {
        return;
      }
    }
    else if (pNVar1 != (Node *)0x0) {
      prettyPrint(this,vertex);
      vertex = pNVar3->right_child;
    }
  } while( true );
}

Assistant:

void SplayTree::prettyPrint(Node *vertex) {
    if (vertex == nullptr){
      std::cout << "empty tree" << std::endl;
    } else if (vertex->left_child != nullptr && vertex->right_child != nullptr) {
      std::cout << vertex->data << ": " << vertex->left_child->data << ", " << vertex->right_child->data << std::endl;
    } else if (vertex->left_child != nullptr) {
      std::cout << vertex->data << ": " << vertex->left_child->data << std::endl;
    } else if (vertex->right_child != nullptr) {
      std::cout << vertex->data << ": " << vertex->right_child->data << std::endl;
    } else {
      std::cout << vertex->data << ": no children" << std::endl;
    }
    if (vertex->left_child != nullptr && vertex->right_child != nullptr) {
      prettyPrint(vertex->left_child);
      prettyPrint(vertex->right_child);
    } else if (vertex->left_child != nullptr) {
      prettyPrint(vertex->left_child);
    } else if (vertex->right_child != nullptr) {
      prettyPrint(vertex->right_child);
    }
  }